

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  int iVar3;
  GCObject **ppGVar4;
  GCObject *pGVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  
  pgVar1 = L->l_G;
  luaC_runtilstate(L,-5);
  iVar3 = (pgVar1->strt).size;
  lVar8 = (long)newsize;
  if (iVar3 < newsize) {
    if (newsize < -1) goto LAB_0010ee82;
    ppGVar4 = (GCObject **)luaM_realloc_(L,(pgVar1->strt).hash,(long)iVar3 << 3,lVar8 * 8);
    (pgVar1->strt).hash = ppGVar4;
    iVar3 = (pgVar1->strt).size;
    for (lVar6 = (long)iVar3; lVar6 < lVar8; lVar6 = lVar6 + 1) {
      (pgVar1->strt).hash[lVar6] = (GCObject *)0x0;
    }
  }
  for (lVar6 = 0; lVar6 < iVar3; lVar6 = lVar6 + 1) {
    ppGVar4 = (pgVar1->strt).hash;
    pGVar5 = ppGVar4[lVar6];
    ppGVar4[lVar6] = (GCObject *)0x0;
    while (pGVar5 != (GCObject *)0x0) {
      pGVar2 = (pGVar5->gch).next;
      uVar7 = (pGVar5->h).sizearray & newsize - 1U;
      (pGVar5->gch).next = (pgVar1->strt).hash[uVar7];
      (pgVar1->strt).hash[uVar7] = pGVar5;
      (pGVar5->gch).marked = (pGVar5->gch).marked & 0xbf;
      pGVar5 = pGVar2;
    }
    iVar3 = (pgVar1->strt).size;
  }
  if (newsize < iVar3) {
    if (newsize < -1) {
LAB_0010ee82:
      luaM_toobig(L);
    }
    ppGVar4 = (GCObject **)luaM_realloc_(L,(pgVar1->strt).hash,(long)iVar3 << 3,lVar8 << 3);
    (pgVar1->strt).hash = ppGVar4;
  }
  (pgVar1->strt).size = newsize;
  return;
}

Assistant:

void luaS_resize (lua_State *L, int newsize) {
  int i;
  stringtable *tb = &G(L)->strt;
  /* cannot resize while GC is traversing strings */
  luaC_runtilstate(L, ~bitmask(GCSsweepstring));
  if (newsize > tb->size) {
    luaM_reallocvector(L, tb->hash, tb->size, newsize, GCObject *);
    for (i = tb->size; i < newsize; i++) tb->hash[i] = NULL;
  }
  /* rehash */
  for (i=0; i<tb->size; i++) {
    GCObject *p = tb->hash[i];
    tb->hash[i] = NULL;
    while (p) {  /* for each node in the list */
      GCObject *next = gch(p)->next;  /* save next */
      unsigned int h = lmod(gco2ts(p)->hash, newsize);  /* new position */
      gch(p)->next = tb->hash[h];  /* chain it */
      tb->hash[h] = p;
      resetoldbit(p);  /* see MOVE OLD rule */
      p = next;
    }
  }
  if (newsize < tb->size) {
    /* shrinking slice must be empty */
    lua_assert(tb->hash[newsize] == NULL && tb->hash[tb->size - 1] == NULL);
    luaM_reallocvector(L, tb->hash, tb->size, newsize, GCObject *);
  }
  tb->size = newsize;
}